

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O1

void __thiscall
xe::ContainerFormatParser::parseContainerValue(ContainerFormatParser *this,string *dst,int *offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  iVar1 = *offset;
  iVar2 = (this->m_buf).m_numElements;
  if (iVar1 < iVar2) {
    bVar7 = (this->m_buf).m_buffer[((this->m_buf).m_back + iVar1) % (this->m_buf).m_size] == '\"';
    if (iVar1 < iVar2 && !bVar7) {
      bVar7 = (this->m_buf).m_buffer[((this->m_buf).m_back + iVar1) % (this->m_buf).m_size] == '\'';
    }
  }
  else {
    bVar7 = false;
  }
  uVar6 = -(uint)bVar7;
  uVar5 = uVar6;
  if ((iVar1 < iVar2) && (bVar7 != false)) {
    uVar5 = (uint)(this->m_buf).m_buffer[((this->m_buf).m_back + iVar1) % (this->m_buf).m_size];
  }
  if ((uVar6 & 1) != 0) {
    *offset = iVar1 + 1;
  }
  dst->_M_string_length = 0;
  *(dst->_M_dataplus)._M_p = '\0';
  while( true ) {
    iVar1 = *offset;
    uVar4 = 0;
    if ((iVar1 < this->m_elementLen) && (uVar4 = 0xffffffff, iVar1 < (this->m_buf).m_numElements)) {
      uVar4 = (ulong)(this->m_buf).m_buffer[(iVar1 + (this->m_buf).m_back) % (this->m_buf).m_size];
    }
    uVar3 = (uint)uVar4;
    if (uVar3 + 1 < 2) break;
    if ((uVar6 & 1) == 0) {
      if ((uVar3 < 0x21) && ((0x100002400U >> (uVar4 & 0x3f) & 1) != 0)) break;
    }
    else if (uVar3 == uVar5) break;
    std::__cxx11::string::push_back((char)dst);
    *offset = *offset + 1;
  }
  if ((uVar6 & 1) != 0) {
    iVar1 = *offset;
    uVar6 = 0xffffffff;
    if (iVar1 < (this->m_buf).m_numElements) {
      uVar6 = (uint)(this->m_buf).m_buffer[((this->m_buf).m_back + iVar1) % (this->m_buf).m_size];
    }
    if (uVar6 == uVar5) {
      *offset = iVar1 + 1;
    }
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerValue (std::string& dst, int& offset) const
{
	DE_ASSERT(offset < m_elementLen);

	bool	isString	= getChar(offset) == '"' || getChar(offset) == '\'';
	int		quotChar	= isString ? getChar(offset) : 0;

	if (isString)
		offset += 1;

	dst.clear();

	for (;;)
	{
		int		curChar		= offset < m_elementLen ? getChar(offset) : 0;
		bool	isEnd		= curChar == 0 || curChar == (int)END_OF_BUFFER ||
							  (isString ? (curChar == quotChar) : (curChar == ' ' || curChar == '\n' || curChar == '\r'));

		if (isEnd)
			break;
		else
		{
			// \todo [2012-06-09 pyry] Escapes.
			dst.push_back((char)curChar);
		}

		offset += 1;
	}

	if (isString && getChar(offset) == quotChar)
		offset += 1;
}